

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
NativeEntryPointData::FreeNativeCode
          (NativeEntryPointData *this,ScriptContext *scriptContext,bool isShutdown)

{
  NativeCodeGenerator *pNVar1;
  code *pcVar2;
  bool bVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  NativeCodeGenerator *pNVar6;
  bool isShutdown_local;
  ScriptContext *scriptContext_local;
  NativeEntryPointData *this_local;
  
  CleanupXDataInfo(this);
  if ((!isShutdown) && (this->nativeAddress != (Type)0x0)) {
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->validationCookie);
    if (*ppvVar4 == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                         ,0x4c,"(this->validationCookie != nullptr)",
                         "this->validationCookie != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->validationCookie);
    pNVar1 = (NativeCodeGenerator *)*ppvVar4;
    pNVar6 = Js::ScriptContext::GetNativeCodeGenerator(scriptContext);
    if (pNVar1 == pNVar6) {
      FreeNativeCodeGenAllocation
                (scriptContext,(JavascriptMethod)this->nativeAddress,
                 (JavascriptMethod)this->thunkAddress);
    }
  }
  this->nativeAddress = (Type)0x0;
  this->thunkAddress = (Type)0x0;
  this->codeSize = 0;
  return;
}

Assistant:

void
NativeEntryPointData::FreeNativeCode(ScriptContext * scriptContext, bool isShutdown)
{
#if PDATA_ENABLED
    this->CleanupXDataInfo();
#endif

    // if scriptContext is shutting down, no need to free that native code
    if (!isShutdown && this->nativeAddress != nullptr)
    {
        // In the debugger case, we might call cleanup after the native code gen that
        // allocated this entry point has already shutdown. In that case, the validation
        // check below should fail and we should not try to free this entry point
        // since it's already been freed
        Assert(this->validationCookie != nullptr);
        if (this->validationCookie == scriptContext->GetNativeCodeGenerator())
        {
            FreeNativeCodeGenAllocation(scriptContext, this->nativeAddress, this->thunkAddress);
        }
    }

#ifdef PERF_COUNTERS
    PERF_COUNTER_SUB(Code, TotalNativeCodeSize, codeSize);
    PERF_COUNTER_SUB(Code, FunctionNativeCodeSize,codeSize);
    PERF_COUNTER_SUB(Code, DynamicNativeCodeSize, codeSize);
#endif

    this->nativeAddress = nullptr;
    this->thunkAddress = nullptr;
    this->codeSize = 0;
}